

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<float>_> *this)

{
  int iVar1;
  long lVar2;
  int64_t newRows;
  TPZMatrix<std::complex<float>_> *pTVar3;
  void *__s;
  complex<float> in_R9;
  ulong uVar4;
  TPZFMatrix<std::complex<float>_> temp1;
  int opt;
  TPZVec<int> local_80;
  int local_60 [6];
  undefined **local_48;
  complex<float> *local_40;
  int64_t iStack_38;
  int64_t local_30;
  
  iVar1 = this->fNEquations;
  lVar2 = (this->fCoarseIndex).fNElements;
  opt = 0x181dee0;
  TPZVec<int>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_80.fStore = local_60;
  local_80.fNElements = 0;
  local_80.fNAlloc = 0;
  local_48 = &PTR__TPZVec_0181a968;
  local_40 = (complex<float> *)0x0;
  iStack_38 = 0;
  local_30 = 0;
  uVar4 = lVar2 * iVar1;
  if (uVar4 != 0) {
    __s = operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    memset(__s,0,uVar4 * 8);
  }
  newRows = (this->fCoarseIndex).fNElements;
  TPZFMatrix<std::complex<float>_>::Resize(&this->fKCi,newRows,newRows);
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar3,&this->fPhiC,&stack0xffffffffffffff48,0);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (&this->fPhiC,(TPZFMatrix<std::complex<float>_> *)&stack0xffffffffffffff48,
             (TPZFMatrix<std::complex<float>_> *)&stack0xffffffffffffff48,&this->fKCi,
             (complex<float>)0x1,in_R9,opt);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<float>_> *)&stack0xffffffffffffff48);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}